

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O1

void __thiscall
soplex::
ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
::~ClassSet(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            *this)

{
  if (this->theitem != (Item *)0x0) {
    free(this->theitem);
    this->theitem = (Item *)0x0;
  }
  if (this->thekey != (DataKey *)0x0) {
    free(this->thekey);
    this->thekey = (DataKey *)0x0;
  }
  return;
}

Assistant:

~ClassSet()
   {
      if(theitem)
         spx_free(theitem);

      if(thekey)
         spx_free(thekey);
   }